

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O1

void xLearn::CheckCSV(DMatrix *matrix,bool disk)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  ulong uVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  index_t *expected;
  pointer pNVar5;
  AssertionResult gtest_ar;
  int n;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  int local_44;
  DMatrix *local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000031,disk) == 0) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_58,"matrix->row_length","kNumLines",&matrix->row_length,&kNumLines);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0xc4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_58,"matrix->row_length","kNumLines",&matrix->row_length,&kNumLines);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                 ,0xc2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
        local_68.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<float,int>
            (local_58,"matrix->Y[0]","0",
             (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
               ,0xc6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (local_58,"matrix->norm[0]","22.03274",
             *(matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start,22.03274);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
               ,199,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (matrix->row_length != 0) {
    local_38 = 0;
    local_40 = matrix;
    do {
      pvVar1 = (matrix->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_38];
      local_44 = 0;
      pNVar5 = (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pNVar5 != *(pointer *)
                     ((long)&(pvVar1->
                             super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                             _M_impl.super__Vector_impl_data + 8)) {
        expected = &pNVar5->feat_id;
        do {
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    (local_58,"iter->feat_id","n",expected,&local_44);
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            pcVar4 = "";
            if (local_50.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                       ,0xcd,pcVar4);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) &&
                 (local_68.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_68.ptr_ + 8))();
              }
              local_68.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_58,"iter->feat_val","0.123",(float)expected[1],0.123);
          if (local_58[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_68);
            pcVar4 = "";
            if (local_50.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                       ,0xce,pcVar4);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (local_68.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) &&
                 (local_68.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_68.ptr_ + 8))();
              }
              local_68.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_44 = local_44 + 1;
          pNVar5 = (pointer)(expected + 2);
          expected = expected + 3;
        } while (pNVar5 != *(pointer *)
                            ((long)&(pvVar1->
                                    super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)
                                    ._M_impl.super__Vector_impl_data + 8));
      }
      local_68.ptr_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>(local_58,"n","3",&local_44,(int *)&local_68);
      uVar2 = local_38;
      matrix = local_40;
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        pcVar4 = "";
        if (local_50.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((local_50.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader_test.cc"
                   ,0xd1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_38 = uVar2 + 1;
    } while (local_38 < matrix->row_length);
  }
  return;
}

Assistant:

void CheckCSV(const DMatrix* matrix, bool disk) {
  if (disk) {
    EXPECT_EQ(matrix->row_length, kNumLines);
  } else {
    EXPECT_EQ(matrix->row_length, kNumLines);
  }
  EXPECT_EQ(matrix->Y[0], 0);
  EXPECT_FLOAT_EQ(matrix->norm[0], 22.03274);
  for (int i = 0; i < matrix->row_length; ++i) {
    SparseRow *row = matrix->row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->feat_id, n);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.123);
      n++;
    }
    EXPECT_EQ(n, 3);
  }
}